

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall
Node::OutputForcedType_abi_cxx11_(string *__return_storage_ptr__,Node *this,VARTYPE VarType)

{
  VARTYPE VVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  VVar1 = GetNodeVarType(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->Type == 0x203) {
    NoParen_abi_cxx11_(&local_f8,this);
LAB_00112b07:
    this_00 = &local_f8;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00);
  }
  else {
    if (VarType == VARTYPE_INTEGER) {
      if (VVar1 - VARTYPE_BYTE < 4) {
LAB_00112afa:
        NoParen_abi_cxx11_(&local_f8,this);
        goto LAB_00112b07;
      }
    }
    else if (VVar1 == VarType) goto LAB_00112afa;
    std::__cxx11::string::string((string *)&local_98,"(",&local_f9);
    OutputVarType_abi_cxx11_(&local_b8,VarType);
    std::operator+(&local_78,&local_98,&local_b8);
    std::operator+(&local_58,&local_78,")(");
    NoParen_abi_cxx11_(&local_d8,this);
    std::operator+(&local_38,&local_58,&local_d8);
    std::operator+(&local_f8,&local_38,")");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
    this_00 = &local_98;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputForcedType(
	VARTYPE VarType		/**< Variable type */
)
{
	int ThisType = GetNodeVarType();	// Var type of this node
	int NeedForce = 0;			// Do we need to force the type
	std::string result;

	//
	// A NULL will match anything
	//
	if (Type == BAS_N_NULL)
	{
		result = NoParen();
		return result;
//		return 0;
	}

	//
	// Determine if we really need to force
	//
	switch(VarType)
	{
	case VARTYPE_INTEGER:
		//
		// Integer type allows for BYTE, INTEGER, LONG
		//
		if ((ThisType != VARTYPE_BYTE) &&
			(ThisType != VARTYPE_WORD) &&
			(ThisType != VARTYPE_INTEGER) &&
			(ThisType != VARTYPE_LONG))
		{
			NeedForce = 1;
		}
		break;

	default:
		if (ThisType != VarType)
		{
			NeedForce = 1;
		}
	}

	//
	// Now force out the proper code
	//
	if (NeedForce)
	{
		result = std::string("(") + OutputVarType(VarType) + ")(" +
			NoParen() + ")";
	}
	else
	{
		result = NoParen();
	}

	return result;
}